

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rusage.c
# Opt level: O1

char * blogc_rusage_format_cpu_time(longlong time)

{
  char *pcVar1;
  
  if (999999 < time) {
    pcVar1 = bc_strdup_printf("%.3fs",(double)time / 1000000.0);
    return pcVar1;
  }
  if (999 < time) {
    pcVar1 = bc_strdup_printf("%.*fms",(double)time / 1000.0,
                              (ulong)((uint)(0x4189374bc6a7ef <
                                            ((ulong)(time * 0x1cac083126e978d5) >> 3 |
                                            time * 0x1cac083126e978d5 << 0x3d)) * 3));
    return pcVar1;
  }
  pcVar1 = bc_strdup_printf("%dus",time);
  return pcVar1;
}

Assistant:

char*
blogc_rusage_format_cpu_time(long long time)
{
    if (time >= 1000000)
        return bc_strdup_printf("%.3fs", ((float) time) / 1000000.0);

    // this is a special case: some systems may report the cpu time rounded up to the
    // milisecond. it is useless to show ".000" in this case.
    if (time >= 1000)
        return bc_strdup_printf("%.*fms", time % 1000 ? 3 : 0, ((float) time) / 1000.0);

    return bc_strdup_printf("%dus", time);
}